

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

ActionResultHolder<void> *
testing::internal::ActionResultHolder<void>::
PerformAction<void(std::__cxx11::string_const&,std::vector<ot::commissioner::ChannelMaskEntry,std::allocator<ot::commissioner::ChannelMaskEntry>>const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
          (Action<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
           *action,ArgumentTuple *args)

{
  ActionResultHolder<void> *pAVar1;
  ArgumentTuple local_18;
  
  local_18.
  super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
  .
  super__Tuple_impl<1UL,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
  .super__Tuple_impl<2UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>.
  super__Head_base<2UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_false>.
  _M_head_impl = (_Head_base<2UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_false>
                  )(args->
                   super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
                   ).
                   super__Tuple_impl<1UL,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
                   .
                   super__Tuple_impl<2UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
                   .
                   super__Head_base<2UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_false>
                   ._M_head_impl;
  local_18.
  super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
  .
  super__Tuple_impl<1UL,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
  .
  super__Head_base<1UL,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_false>
  ._M_head_impl =
       (args->
       super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
       ).
       super__Tuple_impl<1UL,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
       .
       super__Head_base<1UL,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_false>
       ._M_head_impl;
  local_18.
  super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
  .
  super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  ._M_head_impl =
       (args->
       super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
       ).
       super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
       ._M_head_impl;
  Action<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  ::Perform(action,&local_18);
  pAVar1 = (ActionResultHolder<void> *)operator_new(8);
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_002db188;
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    action.Perform(std::move(args));
    return new ActionResultHolder;
  }